

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::RandModeFunc::checkArguments
          (RandModeFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  SourceRange callRange;
  bool bVar1;
  Args *pAVar2;
  reference ppEVar3;
  Type *pTVar4;
  SourceLocation local_88;
  bitmask<slang::ast::ASTFlags> local_58;
  size_t local_50;
  size_t numArgs;
  Compilation *comp;
  Expression *param_4_local;
  Args *args_local;
  ASTContext *context_local;
  RandModeFunc *this_local;
  SourceRange range_local;
  
  range_local.startLoc = range.endLoc;
  this_local = (RandModeFunc *)range.startLoc;
  comp = (Compilation *)param_4;
  param_4_local = (Expression *)args;
  args_local = (Args *)context;
  context_local = (ASTContext *)this;
  numArgs = (size_t)ASTContext::getCompilation(context);
  pAVar2 = args_local + 1;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_58,TopLevelStatement);
  bVar1 = bitmask<slang::ast::ASTFlags>::has((bitmask<slang::ast::ASTFlags> *)pAVar2,&local_58);
  local_50 = (size_t)(int)(uint)bVar1;
  callRange.endLoc = range_local.startLoc;
  callRange.startLoc = (SourceLocation)this_local;
  bVar1 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,(ASTContext *)args_local,true,
                     (Args *)param_4_local,callRange,local_50,local_50);
  if (bVar1) {
    if (local_50 != 0) {
      ppEVar3 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>
                ::operator[]((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                             param_4_local,1);
      pTVar4 = not_null<const_slang::ast::Type_*>::operator->(&(*ppEVar3)->type);
      bVar1 = Type::isIntegral(pTVar4);
      pAVar2 = args_local;
      if (!bVar1) {
        ppEVar3 = nonstd::span_lite::
                  span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                             param_4_local,1);
        pTVar4 = SystemSubroutine::badArg
                           (&this->super_SystemSubroutine,(ASTContext *)pAVar2,*ppEVar3);
        return pTVar4;
      }
    }
    if (local_50 == 0) {
      local_88 = (SourceLocation)Compilation::getIntType((Compilation *)numArgs);
    }
    else {
      local_88 = (SourceLocation)Compilation::getVoidType((Compilation *)numArgs);
    }
    range_local.endLoc = local_88;
  }
  else {
    range_local.endLoc = (SourceLocation)Compilation::getErrorType((Compilation *)numArgs);
  }
  return (Type *)range_local.endLoc;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        // The number of arguments required is 1 if called as a task
        // and 0 if called as a function.
        auto& comp = context.getCompilation();
        size_t numArgs = context.flags.has(ASTFlags::TopLevelStatement) ? 1 : 0;
        if (!checkArgCount(context, true, args, range, numArgs, numArgs))
            return comp.getErrorType();

        if (numArgs) {
            // First argument is integral.
            if (!args[1]->type->isIntegral())
                return badArg(context, *args[1]);
        }

        return numArgs ? comp.getVoidType() : comp.getIntType();
    }